

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_save(t_gobj *z,_binbuf *b)

{
  _gobj *p_Var1;
  t_pd p_Var2;
  short sVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  t_symbol *ptVar13;
  t_symbol *ptVar14;
  t_symbol *ptVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar16;
  t_symbol *srl [3];
  t_symbol *bflcol [3];
  
  iemgui_save((t_iemgui *)z,srl,bflcol);
  if ((*(uint *)&z[0x44].g_pd >> 0x1b & 1) != 0) {
    *(uint *)&z[0x44].g_pd = *(uint *)&z[0x44].g_pd & 0xf7ffffff;
    sys_queuegui(z,(_glist *)z[3].g_pd,my_numbox_draw_update);
  }
  ptVar13 = gensym("#X");
  ptVar14 = gensym("obj");
  sVar3 = *(short *)&z[2].g_next;
  sVar4 = *(short *)((long)&z[2].g_next + 2);
  ptVar15 = gensym("nbx");
  uVar5 = *(uint *)((long)&z[0x4e].g_pd + 4);
  iVar6 = *(int *)&z[4].g_pd;
  iVar7 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  p_Var1 = z[0x4a].g_next;
  p_Var2 = z[0x4b].g_pd;
  uVar8 = *(uint *)&z[0x4c].g_pd;
  iVar11 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar9 = *(uint *)&z[5].g_pd;
  uVar10 = *(uint *)((long)&z[5].g_pd + 4);
  iVar12 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  dVar16 = 0.0;
  if (((ulong)z[0x44].g_next & 1) != 0) {
    dVar16 = (double)*(float *)&z[0x4a].g_pd;
  }
  binbuf_addv(b,"ssiisiiffiisssiiiisssfi",(double)(float)(double)p_Var1,
              (double)(float)(double)p_Var2,dVar16,ptVar13,ptVar14,(ulong)(uint)(int)sVar3,
              (ulong)(uint)(int)sVar4,ptVar15,(ulong)uVar5,(long)iVar6 / (long)iVar7 & 0xffffffff,
              (ulong)uVar8,CONCAT44(extraout_var,iVar11),srl[0],srl[1],srl[2],(ulong)uVar9,
              (ulong)uVar10,CONCAT44(extraout_var_00,iVar12),
              (ulong)*(uint *)((long)&z[0x44].g_pd + 4),bflcol[0],bflcol[1],bflcol[2],
              (ulong)*(uint *)&z[0x4e].g_next);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void my_numbox_save(t_gobj *z, t_binbuf *b)
{
    t_my_numbox *x = (t_my_numbox *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    iemgui_save(&x->x_gui, srl, bflcol);
    if(x->x_gui.x_fsf.x_change)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    binbuf_addv(b, "ssiisiiffiisssiiiisssfi", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix, (int)x->x_gui.x_obj.te_ypix,
                gensym("nbx"), x->x_numwidth, x->x_gui.x_h/IEMGUI_ZOOM(x),
                (t_float)x->x_min, (t_float)x->x_max,
                x->x_lin0_log1, iem_symargstoint(&x->x_gui.x_isa),
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_val:0., x->x_log_height);
    binbuf_addv(b, ";");
}